

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O1

DATA duckdb::TemplatedListReader::Initialize(optional_ptr<duckdb::Vector,_true> result_out)

{
  list_entry_t *plVar1;
  Vector *in_RDI;
  DATA DVar2;
  optional_ptr<duckdb::Vector,_true> local_18;
  
  local_18.ptr = in_RDI;
  optional_ptr<duckdb::Vector,_true>::CheckValid(&local_18);
  plVar1 = *(list_entry_t **)(local_18.ptr + 0x20);
  optional_ptr<duckdb::Vector,_true>::CheckValid(&local_18);
  FlatVector::VerifyFlatVector(local_18.ptr);
  DVar2.result_mask = (ValidityMask *)(local_18.ptr + 0x28);
  DVar2.result_ptr = plVar1;
  return DVar2;
}

Assistant:

static DATA Initialize(optional_ptr<Vector> result_out) {
		D_ASSERT(ListVector::GetListSize(*result_out) == 0);

		auto result_ptr = FlatVector::GetData<list_entry_t>(*result_out);
		auto &result_mask = FlatVector::Validity(*result_out);
		return ListReaderData(result_ptr, result_mask);
	}